

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::MacroActualArgumentListSyntax::MacroActualArgumentListSyntax
          (MacroActualArgumentListSyntax *this,Token openParen,
          SeparatedSyntaxList<slang::syntax::MacroActualArgumentSyntax> *args,Token closeParen)

{
  size_t sVar1;
  SyntaxNode *pSVar2;
  undefined4 uVar3;
  MacroActualArgumentSyntax *pMVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  SeparatedSyntaxList<slang::syntax::MacroActualArgumentSyntax> *__range2;
  iterator __begin2;
  iterator_base<slang::syntax::MacroActualArgumentSyntax_*> local_30;
  
  uVar5 = openParen._0_8_;
  uVar6 = closeParen._0_8_;
  (this->super_SyntaxNode).kind = MacroActualArgumentList;
  (this->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (this->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  (this->openParen).kind = (short)uVar5;
  (this->openParen).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->openParen).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->openParen).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->openParen).info = openParen.info;
  uVar3 = *(undefined4 *)&(args->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar2 = (args->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->args).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->args).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
  (this->args).super_SyntaxListBase.super_SyntaxNode.parent = pSVar2;
  (this->args).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->args).super_SyntaxListBase.childCount = (args->super_SyntaxListBase).childCount;
  (this->args).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_0057ae38;
  sVar1 = (args->elements)._M_extent._M_extent_value;
  (this->args).elements._M_ptr = (args->elements)._M_ptr;
  (this->args).elements._M_extent._M_extent_value = sVar1;
  (this->closeParen).kind = (short)uVar6;
  (this->closeParen).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->closeParen).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->closeParen).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->closeParen).info = closeParen.info;
  (this->args).super_SyntaxListBase.super_SyntaxNode.parent = &this->super_SyntaxNode;
  local_30.index = 0;
  sVar1 = (this->args).elements._M_extent._M_extent_value;
  local_30.list = &this->args;
  for (; (local_30.list != &this->args || (local_30.index != sVar1 + 1 >> 1));
      local_30.index = local_30.index + 1) {
    pMVar4 = SeparatedSyntaxList<slang::syntax::MacroActualArgumentSyntax>::
             iterator_base<slang::syntax::MacroActualArgumentSyntax_*>::dereference(&local_30);
    (pMVar4->super_SyntaxNode).parent = &this->super_SyntaxNode;
  }
  return;
}

Assistant:

MacroActualArgumentListSyntax(Token openParen, const SeparatedSyntaxList<MacroActualArgumentSyntax>& args, Token closeParen) :
        SyntaxNode(SyntaxKind::MacroActualArgumentList), openParen(openParen), args(args), closeParen(closeParen) {
        this->args.parent = this;
        for (auto child : this->args)
            child->parent = this;
    }